

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::crop(mipmapped_texture *this,uint x,uint y,uint width,uint height)

{
  bool bVar1;
  image_u8 *this_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *p;
  mip_level *pmVar2;
  uint *init1;
  uint height_local;
  uint width_local;
  face_vec faces;
  image_u8 tmp;
  
  if (((this->m_faces).m_size == 1) && (height != 0 && width != 0)) {
    tmp.m_width = 0;
    tmp.m_height = 0;
    tmp.m_pitch = 0;
    tmp.m_total = 0;
    tmp.m_comp_flags = 0xf;
    tmp.m_pixel_buf.m_size = 0;
    tmp.m_pixel_buf.m_capacity = 0;
    tmp.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
    tmp.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
    height_local = height;
    width_local = width;
    this_00 = mip_level::get_unpacked_image(*((this->m_faces).m_p)->m_p,&tmp,3);
    p = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                  ((crnlib *)&width_local,&height_local,init1);
    bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                      (this_00,p->m_pPixels,x,y,width_local,height_local,false);
    if (bVar1) {
      vector<crnlib::vector<crnlib::mip_level_*>_>::vector(&faces,1);
      vector<crnlib::mip_level_*>::resize(faces.m_p,1,false);
      pmVar2 = crnlib_new<crnlib::mip_level>();
      *(faces.m_p)->m_p = pmVar2;
      p->m_comp_flags = this_00->m_comp_flags;
      mip_level::assign(*(faces.m_p)->m_p,p,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
      assign(this,&faces);
      vector<crnlib::vector<crnlib::mip_level_*>_>::~vector(&faces);
    }
    vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&tmp.m_pixel_buf);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool mipmapped_texture::crop(uint x, uint y, uint width, uint height) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;
  if (get_num_faces() > 1)
    return false;

  if ((width < 1) || (height < 1))
    return false;

  image_u8 tmp;
  image_u8* pImg = get_level(0, 0)->get_unpacked_image(tmp, cUnpackFlagUncook | cUnpackFlagUnflip);

  image_u8* pMip = crnlib_new<image_u8>(width, height);

  if (!pImg->extract_block(pMip->get_ptr(), x, y, width, height))
    return false;

  face_vec faces(1);
  faces[0].resize(1);
  faces[0][0] = crnlib_new<mip_level>();

  pMip->set_comp_flags(pImg->get_comp_flags());

  faces[0][0]->assign(pMip);

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}